

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexTriangleFilter::applyIter
          (PtexTriangleFilter *this,PtexTriangleKernelIter *k,PtexFaceData *dh)

{
  float *pfVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined3 uVar7;
  byte bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  undefined4 extraout_var;
  long *plVar18;
  long lVar19;
  undefined4 extraout_var_01;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  PtexTriangleKernelIter kt;
  PtexTriangleKernelIter local_78;
  ulong local_38;
  undefined4 uVar6;
  undefined4 extraout_var_00;
  
  iVar10 = (*dh->_vptr_PtexFaceData[3])(dh);
  if ((char)iVar10 == '\0') {
    iVar10 = (*dh->_vptr_PtexFaceData[7])(dh);
    if ((char)iVar10 != '\0') {
      iVar11 = (*dh->_vptr_PtexFaceData[8])(dh);
      bVar8 = (byte)((uint)iVar11 >> 8);
      local_78.w2 = k->w2;
      local_78.A = k->A;
      uVar3 = k->B;
      uVar4 = k->C;
      uVar5 = k->valid;
      uVar7 = *(undefined3 *)&k->field_0x31;
      uVar6 = CONCAT31(uVar7,uVar5);
      local_78.wscale = k->wscale;
      local_78.weight = k->weight;
      uVar24 = 1 << ((byte)iVar11 & 0x1f);
      uVar23 = 1 << (bVar8 & 0x1f);
      local_78.u = 0.0;
      local_78.rowlen = uVar24;
      iVar10 = k->rowlen;
      iVar12 = iVar10 / (int)uVar24;
      uVar2 = (long)k->v1 / (long)(int)uVar23;
      local_38 = uVar2 & 0xffffffff;
      iVar13 = (k->v2 + -1) / (int)uVar23;
      iVar14 = (int)uVar2;
      if (iVar13 < iVar14) {
        return;
      }
      iVar14 = iVar14 * iVar12;
      local_78.B = (float)uVar3;
      local_78.C = (float)uVar4;
      local_78._48_4_ = uVar6;
      do {
        iVar21 = (int)local_38 << (bVar8 & 0x1f);
        local_78.u1 = 0;
        local_78.v = k->v - (float)iVar21;
        local_78.v1 = k->v1 - iVar21;
        if (local_78.v1 < 1) {
          local_78.v1 = 0;
        }
        local_78.w1 = 0;
        uVar15 = k->v2 - iVar21;
        if ((int)uVar23 <= (int)uVar15) {
          uVar15 = uVar23;
        }
        local_78._24_8_ = (ulong)uVar15 << 0x20;
        uVar2 = (long)k->u1 / (long)(int)uVar24;
        uVar26 = uVar2 & 0xffffffff;
        iVar16 = (k->u2 + -1) / (int)uVar24;
        if ((int)uVar2 <= iVar16) {
          do {
            iVar25 = (int)uVar26;
            iVar17 = iVar25 << ((byte)iVar11 & 0x1f);
            iVar22 = iVar10 - (iVar21 + uVar24 + iVar17);
            local_78.u = k->u - (float)iVar17;
            iVar20 = k->u1 - iVar17;
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            local_78.u1 = iVar20;
            uVar15 = k->u2 - iVar17;
            if ((int)uVar24 <= (int)uVar15) {
              uVar15 = uVar24;
            }
            local_78.u2 = uVar15;
            local_78.w1 = k->w1 - iVar22;
            local_78.w2 = k->w2 - iVar22;
            iVar17 = (*dh->_vptr_PtexFaceData[9])(dh,(ulong)(uint)(iVar14 + iVar25));
            plVar18 = (long *)CONCAT44(extraout_var_00,iVar17);
            if (plVar18 != (long *)0x0) {
              local_78._52_8_ = local_78._52_8_ & 0xffffffff;
              cVar9 = (**(code **)(*plVar18 + 0x18))(plVar18);
              if (cVar9 == '\0') {
                pfVar1 = this->_result;
                lVar19 = (**(code **)(*plVar18 + 0x30))(plVar18);
                uVar15 = this->_nchan;
                iVar17 = uVar15 * 4;
                if (4 < uVar15) {
                  iVar17 = 0;
                }
                iVar20 = iVar17 + 0x14;
                if (uVar15 == this->_ntxchan) {
                  iVar20 = iVar17;
                }
                (**(code **)(PtexTriangleKernelIter::applyFunctions +
                            (long)(int)(iVar20 + this->_dt) * 8))
                          (&local_78,pfVar1,lVar19 + this->_firstChanOffset);
              }
              else {
                pfVar1 = this->_result;
                lVar19 = (**(code **)(*plVar18 + 0x30))(plVar18);
                PtexTriangleKernelIter::applyConst
                          (&local_78,pfVar1,(void *)(lVar19 + this->_firstChanOffset),this->_dt,
                           this->_nchan);
              }
              this->_weight = local_78.weight + this->_weight;
              if (plVar18 != (long *)0x0) {
                (**(code **)(*plVar18 + 0x10))(plVar18);
              }
            }
            uVar26 = (ulong)(iVar25 + 1U);
          } while (iVar16 + 1U != iVar25 + 1U);
        }
        iVar21 = (int)local_38;
        iVar14 = iVar14 + iVar12;
        local_38 = (ulong)(iVar21 + 1);
      } while (iVar21 != iVar13);
      return;
    }
    pfVar1 = this->_result;
    iVar14 = (*dh->_vptr_PtexFaceData[6])();
    uVar23 = this->_nchan;
    iVar10 = 0;
    if (uVar23 < 5) {
      iVar10 = uVar23 * 4;
    }
    iVar11 = iVar10 + 0x14;
    if (uVar23 == this->_ntxchan) {
      iVar11 = iVar10;
    }
    (**(code **)(PtexTriangleKernelIter::applyFunctions + (long)(int)(iVar11 + this->_dt) * 8))
              (k,pfVar1,(long)this->_firstChanOffset + CONCAT44(extraout_var_01,iVar14));
  }
  else {
    pfVar1 = this->_result;
    iVar10 = (*dh->_vptr_PtexFaceData[6])(dh);
    PtexTriangleKernelIter::applyConst
              (k,pfVar1,(void *)((long)this->_firstChanOffset + CONCAT44(extraout_var,iVar10)),
               this->_dt,this->_nchan);
  }
  this->_weight = k->weight + this->_weight;
  return;
}

Assistant:

void PtexTriangleFilter::applyIter(PtexTriangleKernelIter& k, PtexFaceData* dh)
{
    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        _weight += k.weight;
    }
    else if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexTriangleKernelIter kt = k;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        kt.rowlen = tileresu;
        int ntilesu = k.rowlen / kt.rowlen;
        int wOffsetBase = k.rowlen - tileresu;
        for (int tilev = k.v1 / tileresv, tilevEnd = (k.v2-1) / tileresv; tilev <= tilevEnd; tilev++) {
            int vOffset = tilev * tileresv;
            kt.v = k.v - (float)vOffset;
            kt.v1 = PtexUtils::max(0, k.v1 - vOffset);
            kt.v2 = PtexUtils::min(k.v2 - vOffset, tileresv);
            for (int tileu = k.u1 / tileresu, tileuEnd = (k.u2-1) / tileresu; tileu <= tileuEnd; tileu++) {
                int uOffset = tileu * tileresu;
                int wOffset = wOffsetBase - uOffset - vOffset;
                kt.u = k.u - (float)uOffset;
                kt.u1 = PtexUtils::max(0, k.u1 - uOffset);
                kt.u2 = PtexUtils::min(k.u2 - uOffset, tileresu);
                kt.w1 = k.w1 - wOffset;
                kt.w2 = k.w2 - wOffset;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    kt.weight = 0;
                    if (th->isConstant())
                        kt.applyConst(_result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(_result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                    _weight += kt.weight;
                }
            }
        }
    }
    else {
        k.apply(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
        _weight += k.weight;
    }
}